

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstring.cpp
# Opt level: O1

int32_t T_CString_int64ToString_63(char *buffer,int64_t v,uint32_t radix)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  uint uVar4;
  byte *__src;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  bool bVar9;
  char tbuf [30];
  byte local_c [4];
  ulong uVar5;
  
  bVar9 = v < 0;
  if (radix == 10 && bVar9) {
    v = -v;
    *buffer = '-';
  }
  uVar6 = (ulong)(radix == 10 && bVar9);
  __src = local_c + 1;
  local_c[1] = 0;
  uVar7 = CONCAT44(0,radix);
  uVar5 = uVar6;
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar7;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = v;
    bVar3 = SUB161(auVar2 % auVar1,0);
    bVar8 = bVar3 + 0x37;
    if ((SUB164(auVar2 % auVar1,0) & 0xfe) < 10) {
      bVar8 = bVar3 | 0x30;
    }
    __src[-1] = bVar8;
    __src = __src + -1;
    uVar4 = (int)uVar5 + 1;
    uVar5 = (ulong)uVar4;
    bVar9 = uVar7 <= (ulong)v;
    v = (ulong)v / uVar7;
  } while (bVar9);
  strcpy(buffer + uVar6,(char *)__src);
  return uVar4;
}

Assistant:

U_CAPI int32_t U_EXPORT2
T_CString_int64ToString(char* buffer, int64_t v, uint32_t radix)
{
    char      tbuf[30];
    int32_t   tbx    = sizeof(tbuf);
    uint8_t   digit;
    int32_t   length = 0;
    uint64_t  uval;
    
    U_ASSERT(radix>=2 && radix<=16);
    uval = (uint64_t) v;
    if(v<0 && radix == 10) {
        /* Only in base 10 do we conside numbers to be signed. */
        uval = (uint64_t)(-v); 
        buffer[length++] = '-';
    }
    
    tbx = sizeof(tbuf)-1;
    tbuf[tbx] = 0;   /* We are generating the digits backwards.  Null term the end. */
    do {
        digit = (uint8_t)(uval % radix);
        tbuf[--tbx] = (char)(T_CString_itosOffset(digit));
        uval  = uval / radix;
    } while (uval != 0);
    
    /* copy converted number into user buffer  */
    uprv_strcpy(buffer+length, tbuf+tbx);
    length += sizeof(tbuf) - tbx -1;
    return length;
}